

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

Marray<int,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::operator=
          (Marray<int,std::allocator<unsigned_long>> *this,
          View<short,_false,_std::allocator<unsigned_long>_> *in)

{
  reference piVar1;
  reference piVar2;
  pointer psVar3;
  size_t *psVar4;
  size_t *psVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  reference piVar10;
  reference piVar11;
  int *piVar12;
  short *psVar13;
  unsigned_long *puVar14;
  size_t sVar15;
  reference psVar16;
  reference psVar17;
  runtime_error *this_00;
  ulong uVar18;
  void *dataPointer_;
  void *vDataPointer_;
  Marray<int,_std::allocator<unsigned_long>_> m;
  Iterator<short,_true,_std::allocator<unsigned_long>_> local_70;
  long local_40;
  
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
  if ((View<short,_false,_std::allocator<unsigned_long>_> *)this != in) {
    if (in->data_ != (pointer)0x0) {
      View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
      View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
      piVar1 = *(reference *)this;
      if ((piVar1 != (reference)0x0) && (piVar2 = (reference)in->data_, piVar2 != (reference)0x0)) {
        piVar10 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,
                             *(long *)(this + 0x30) - 1);
        piVar11 = (reference)
                  View<short,_false,_std::allocator<unsigned_long>_>::operator()
                            (in,(in->geometry_).size_ - 1);
        if (((piVar1 <= piVar2) && (piVar2 <= piVar10)) ||
           ((piVar2 <= piVar1 && (piVar1 <= piVar11)))) {
          Marray<short,false,std::allocator<unsigned_long>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_70,in);
          Marray<int,_std::allocator<unsigned_long>_>::operator=
                    ((Marray<int,_std::allocator<unsigned_long>_> *)this,
                     (Marray<int,_std::allocator<unsigned_long>_> *)&local_70);
          operator_delete((void *)CONCAT44(local_70.view_._4_4_,local_70.view_._0_4_),local_40 << 2)
          ;
          uVar18 = (long)local_70.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage * 0x18;
LAB_0014acd9:
          operator_delete((void *)local_70.index_,uVar18);
          goto LAB_0014b182;
        }
      }
      if (*(size_t *)(this + 0x30) != (in->geometry_).size_) {
        operator_delete(*(void **)this,*(size_t *)(this + 0x30) << 2);
        piVar12 = __gnu_cxx::new_allocator<int>::allocate
                            ((new_allocator<int> *)(this + 0x40),(in->geometry_).size_,(void *)0x0);
        *(int **)this = piVar12;
      }
      if (in->data_ == (pointer)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
      else {
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
                  ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),(in->geometry_).dimension_
                  );
        psVar3 = in->data_;
        if (psVar3 != (pointer)0x0) {
          psVar4 = (in->geometry_).shape_;
          psVar5 = (in->geometry_).shapeStrides_;
          lVar6 = *(long *)(this + 0x10);
          lVar7 = *(long *)(this + 0x18);
          lVar8 = *(long *)(this + 0x20);
          uVar18 = 0;
LAB_0014ad44:
          if (uVar18 < (in->geometry_).dimension_) {
            if (uVar18 < (in->geometry_).dimension_) {
              if (uVar18 < *(ulong *)(this + 0x28)) {
                *(size_t *)(lVar6 + uVar18 * 8) = psVar4[uVar18];
                if (uVar18 < (in->geometry_).dimension_) {
                  if (uVar18 < *(ulong *)(this + 0x28)) {
                    *(size_t *)(lVar7 + uVar18 * 8) = psVar5[uVar18];
                    if (uVar18 < (in->geometry_).dimension_) {
                      if (uVar18 < *(ulong *)(this + 0x28)) goto code_r0x0014ad96;
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_00,"Assertion failed.");
                    }
                    else {
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_00,"Assertion failed.");
                    }
                  }
                  else {
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,"Assertion failed.");
                  }
                }
                else {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_00,"Assertion failed.");
                }
              }
              else {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"Assertion failed.");
              }
            }
            else {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Assertion failed.");
            }
          }
          else {
            *(size_t *)(this + 0x30) = (in->geometry_).size_;
            this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
            View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
            *(CoordinateOrder *)(this + 0x38) = (in->geometry_).coordinateOrder_;
            View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
            if (in->data_ != (pointer)0x0) {
              switch((in->geometry_).dimension_) {
              case 1:
                piVar12 = *(int **)this;
                local_70.view_._0_4_ = 0;
                psVar13 = marray_detail::AccessOperatorHelper<true>::
                          execute<short,int,false,std::allocator<unsigned_long>>
                                    (in,(int *)&local_70);
                sVar15 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                                   ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
                if (sVar15 != 0) {
                  uVar18 = 0;
                  do {
                    *piVar12 = (int)*psVar13;
                    sVar15 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                                       ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
                    piVar12 = piVar12 + sVar15;
                    sVar15 = View<short,_false,_std::allocator<unsigned_long>_>::strides(in,0);
                    psVar13 = psVar13 + sVar15;
                    uVar18 = uVar18 + 1;
                    sVar15 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                                       ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
                  } while (uVar18 < sVar15);
                }
                View<int,_false,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
                View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
                View<short,_false,_std::allocator<unsigned_long>_>::shape(in,0);
                View<short,_false,_std::allocator<unsigned_long>_>::strides(in,0);
                break;
              case 2:
                uVar9 = *(undefined8 *)this;
                local_70.view_._0_4_ = 0;
                psVar16 = marray_detail::AccessOperatorHelper<true>::
                          execute<short,int,false,std::allocator<unsigned_long>>
                                    (in,(int *)&local_70);
                marray_detail::
                OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<int,_short>,_int,_short,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(this,in,uVar9,psVar16);
                break;
              case 3:
                uVar9 = *(undefined8 *)this;
                local_70.view_._0_4_ = 0;
                psVar16 = marray_detail::AccessOperatorHelper<true>::
                          execute<short,int,false,std::allocator<unsigned_long>>
                                    (in,(int *)&local_70);
                marray_detail::
                OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<int,_short>,_int,_short,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(this,in,uVar9,psVar16);
                break;
              case 4:
                uVar9 = *(undefined8 *)this;
                local_70.view_._0_4_ = 0;
                psVar16 = marray_detail::AccessOperatorHelper<true>::
                          execute<short,int,false,std::allocator<unsigned_long>>
                                    (in,(int *)&local_70);
                marray_detail::
                OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<int,_short>,_int,_short,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(this,in,uVar9,psVar16);
                break;
              default:
                sVar15 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(in);
                if (sVar15 == 5) {
                  uVar9 = *(undefined8 *)this;
                  local_70.view_._0_4_ = 0;
                  psVar16 = marray_detail::AccessOperatorHelper<true>::
                            execute<short,int,false,std::allocator<unsigned_long>>
                                      (in,(int *)&local_70);
                  marray_detail::
                  OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<int,_short>,_int,_short,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::operate(this,in,uVar9,psVar16);
                }
                else {
                  sVar15 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(in);
                  if (sVar15 == 6) {
                    uVar9 = *(undefined8 *)this;
                    local_70.view_._0_4_ = 0;
                    psVar16 = marray_detail::AccessOperatorHelper<true>::
                              execute<short,int,false,std::allocator<unsigned_long>>
                                        (in,(int *)&local_70);
                    marray_detail::
                    OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<int,_short>,_int,_short,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operate(this,in,uVar9,psVar16);
                  }
                  else {
                    sVar15 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(in);
                    if (sVar15 == 7) {
                      uVar9 = *(undefined8 *)this;
                      local_70.view_._0_4_ = 0;
                      psVar16 = marray_detail::AccessOperatorHelper<true>::
                                execute<short,int,false,std::allocator<unsigned_long>>
                                          (in,(int *)&local_70);
                      marray_detail::
                      OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<int,_short>,_int,_short,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::operate(this,in,uVar9,psVar16);
                    }
                    else {
                      sVar15 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(in);
                      if (sVar15 == 8) {
                        uVar9 = *(undefined8 *)this;
                        local_70.view_._0_4_ = 0;
                        psVar16 = marray_detail::AccessOperatorHelper<true>::
                                  execute<short,int,false,std::allocator<unsigned_long>>
                                            (in,(int *)&local_70);
                        marray_detail::
                        OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<int,_short>,_int,_short,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(this,in,uVar9,psVar16);
                      }
                      else {
                        sVar15 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(in);
                        if (sVar15 == 9) {
                          uVar9 = *(undefined8 *)this;
                          local_70.view_._0_4_ = 0;
                          psVar16 = marray_detail::AccessOperatorHelper<true>::
                                    execute<short,int,false,std::allocator<unsigned_long>>
                                              (in,(int *)&local_70);
                          marray_detail::
                          OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<int,_short>,_int,_short,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(this,in,uVar9,psVar16);
                        }
                        else {
                          sVar15 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(in)
                          ;
                          if (sVar15 != 10) {
                            View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
                            Iterator<short,_true,_std::allocator<unsigned_long>_>::Iterator
                                      (&local_70,in,0);
                            for (uVar18 = 0; uVar18 < *(ulong *)(this + 0x30); uVar18 = uVar18 + 1)
                            {
                              psVar17 = Iterator<short,_true,_std::allocator<unsigned_long>_>::
                                        operator*(&local_70);
                              *(int *)(*(long *)this + uVar18 * 4) = (int)*psVar17;
                              Iterator<short,_true,_std::allocator<unsigned_long>_>::operator++
                                        (&local_70);
                            }
                            if (local_70.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) break;
                            uVar18 = (long)local_70.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)local_70.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                            local_70.index_ =
                                 (size_t)local_70.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                            goto LAB_0014acd9;
                          }
                          uVar9 = *(undefined8 *)this;
                          local_70.view_._0_4_ = 0;
                          psVar16 = marray_detail::AccessOperatorHelper<true>::
                                    execute<short,int,false,std::allocator<unsigned_long>>
                                              (in,(int *)&local_70);
                          marray_detail::
                          OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<int,_short>,_int,_short,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(this,in,uVar9,psVar16);
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_0014b182;
            }
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
          }
          goto LAB_0014b25a;
        }
LAB_0014ada6:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
      goto LAB_0014b25a;
    }
    operator_delete(*(void **)this,*(long *)(this + 0x30) << 2);
    *(undefined8 *)this = 0;
    if (in != (View<short,_false,_std::allocator<unsigned_long>_> *)this) {
      if ((in->geometry_).dimension_ != *(size_t *)(this + 0x28)) {
        operator_delete(*(void **)(this + 0x10),*(size_t *)(this + 0x28) * 0x18);
        sVar15 = (in->geometry_).dimension_;
        *(size_t *)(this + 0x28) = sVar15;
        puVar14 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                            ((new_allocator<unsigned_long> *)(this + 8),sVar15 * 3,(void *)0x0);
        *(unsigned_long **)(this + 0x10) = puVar14;
        *(unsigned_long **)(this + 0x18) = puVar14 + *(long *)(this + 0x28);
        *(unsigned_long **)(this + 0x20) = puVar14 + *(long *)(this + 0x28) + *(long *)(this + 0x28)
        ;
        *(size_t *)(this + 0x28) = (in->geometry_).dimension_;
      }
      memcpy(*(void **)(this + 0x10),(in->geometry_).shape_,*(long *)(this + 0x28) * 0x18);
      *(size_t *)(this + 0x30) = (in->geometry_).size_;
      *(CoordinateOrder *)(this + 0x38) = (in->geometry_).coordinateOrder_;
      this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)(in->geometry_).isSimple_;
    }
  }
LAB_0014b182:
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] != (Marray<int,std::allocator<unsigned_long>>)0x0) {
    return (Marray<int,_std::allocator<unsigned_long>_> *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_0014b25a:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
code_r0x0014ad96:
  *(size_t *)(lVar8 + uVar18 * 8) = psVar5[uVar18];
  uVar18 = uVar18 + 1;
  if (psVar3 == (pointer)0x0) goto LAB_0014ada6;
  goto LAB_0014ad44;
}

Assistant:

Marray<T, A>&
Marray<T, A>::operator=
(
    const View<TLocal, isConstLocal, ALocal>& in
)
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if( (void*)(this) != (void*)(&in) ) { // no self-assignment
        if(in.data_ == 0) {
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = 0;
            this->geometry_ = in.geometry_;
        }
        else if(this->overlaps(in)) {
            Marray<T, A> m = in; // temporary copy
            (*this) = m;
        }
        else {
            // re-alloc memory if necessary
            if(this->size() != in.size()) {
                dataAllocator_.deallocate(this->data_, this->size());
                this->data_ = dataAllocator_.allocate(in.size());
            }

            // copy geometry
            this->geometry_.resize(in.dimension());
            for(std::size_t j=0; j<in.dimension(); ++j) {
                this->geometry_.shape(j) = in.geometry_.shape(j);
                this->geometry_.shapeStrides(j) = in.geometry_.shapeStrides(j);
                this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
            }
            this->geometry_.size() = in.size();
            this->geometry_.isSimple() = true;
            this->geometry_.coordinateOrder() = in.coordinateOrder();

            // copy data
            if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
                memcpy(this->data_, in.data_, (in.size())*sizeof(T));
            }
            else if(in.dimension() == 1)
                marray_detail::OperateHelperBinary<1, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 2)
                marray_detail::OperateHelperBinary<2, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 3)
                marray_detail::OperateHelperBinary<3, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 4)
                marray_detail::OperateHelperBinary<4, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 5)
                marray_detail::OperateHelperBinary<5, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 6)
                marray_detail::OperateHelperBinary<6, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 7)
                marray_detail::OperateHelperBinary<7, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 8)
                marray_detail::OperateHelperBinary<8, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 9)
                marray_detail::OperateHelperBinary<9, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 10)
                marray_detail::OperateHelperBinary<10, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else {
                typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
                for(std::size_t j=0; j<this->size(); ++j, ++it) {
                    this->data_[j] = static_cast<T>(*it);
                }
            }
        }
    }
    testInvariant();
    return *this;
}